

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

int ON_ComparePointList(int dim,bool is_rat,int point_count,int point_strideA,double *pointA,
                       int point_strideB,double *pointB)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int local_84;
  int local_7c;
  int k;
  double B [3];
  double local_58;
  double A [3];
  int local_30;
  int iStack_2c;
  bool bDoSecondCheck;
  int rc1;
  int rc;
  int i;
  int point_strideB_local;
  double *pointA_local;
  int point_strideA_local;
  int point_count_local;
  bool is_rat_local;
  int dim_local;
  
  iStack_2c = 0;
  local_30 = 0;
  bVar1 = false;
  if (((is_rat) && (bVar1 = false, dim < 4)) && (bVar1 = false, 0 < point_count)) {
    bVar2 = ON_IsValid(pointA[dim]);
    bVar1 = false;
    if (bVar2) {
      bVar1 = false;
      if ((pointA[dim] != 0.0) || (NAN(pointA[dim]))) {
        bVar2 = ON_IsValid(pointB[dim]);
        bVar1 = false;
        if (bVar2) {
          bVar1 = pointB[dim] != 0.0;
        }
      }
    }
  }
  memset(&local_58,0,0x18);
  memset(&stack0xffffffffffffff88,0,0x18);
  _i = pointA;
  for (rc1 = 0; rc1 < point_count && iStack_2c == 0; rc1 = rc1 + 1) {
    iStack_2c = ON_ComparePoint(dim,is_rat,_i,pointB);
    if ((((iStack_2c != 0) && (bVar1)) && ((_i[dim] != 0.0 || (NAN(_i[dim]))))) &&
       ((pointB[dim] != 0.0 || (NAN(pointB[dim]))))) {
      if (local_30 == 0) {
        local_30 = iStack_2c;
      }
      for (local_7c = 0; local_7c < dim; local_7c = local_7c + 1) {
        A[(long)local_7c + -1] = _i[local_7c] / _i[dim];
        *(double *)(&stack0xffffffffffffff88 + (long)local_7c * 8) = pointB[local_7c] / pointB[dim];
      }
      iVar3 = ON_ComparePoint(dim,false,&local_58,(double *)&stack0xffffffffffffff88);
      if (iVar3 == 0) {
        local_84 = 0;
      }
      else {
        local_84 = local_30;
      }
      iStack_2c = local_84;
    }
    _i = _i + point_strideA;
    pointB = pointB + point_strideB;
  }
  return iStack_2c;
}

Assistant:

int 
ON_ComparePointList( // returns 
                              // -1: first < second
                              //  0: first == second
                              // +1: first > second
          int dim,
          bool is_rat,
          int point_count,
          int point_strideA,
          const double* pointA,
          int point_strideB,
          const double* pointB
          )
{
  int i, rc = 0, rc1 = 0;
  const bool bDoSecondCheck = ( 1 == is_rat && dim <= 3 && point_count > 0 
                         && ON_IsValid(pointA[dim]) && 0.0 != pointA[dim]
                         && ON_IsValid(pointB[dim]) && 0.0 != pointB[dim]
                         );
  double A[3] = {0.0,0.0,0.0};
  double B[3] = {0.0,0.0,0.0};
  //const size_t AB_size = dim*sizeof(A[0]);

  for ( i = 0; i < point_count && !rc; i++ ) 
  {
    rc = ON_ComparePoint( dim, is_rat, pointA, pointB );
    if (    rc && bDoSecondCheck 
      && 0.0 != pointA[dim] && 0.0 != pointB[dim]
      )
    {
      if ( !rc1 )
        rc1 = rc;
      // bDoSecondCheck = true ensures is_rat is true and pointX[dim] != 0.0
      for(int k = 0; k < dim; k++) 
      {
        A[k] = pointA[k]/pointA[dim];      
        B[k] = pointB[k]/pointB[dim];
      }
      rc = ( 0 == ON_ComparePoint( dim, 0, A, B ) ) ? 0 : rc1;
    }
    pointA += point_strideA;
    pointB += point_strideB;
  }

  return rc;
}